

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDebug(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *format;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      format = "Empty network.\n";
    }
    else {
      if (pNtk->ntkType == ABC_NTK_LOGIC) {
        Abc_NtkAutoDebug(pNtk,Abc_NtkRetimeDebug);
        return 0;
      }
      format = "This command is applicable to logic networks.\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: debug [-h]\n");
    Abc_Print(-2,"\t        performs automated debugging of the given procedure\n");
    format = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandDebug( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    extern void Abc_NtkAutoDebug( Abc_Ntk_t * pNtk, int (*pFuncError) (Abc_Ntk_t *) );
    extern int Abc_NtkRetimeDebug( Abc_Ntk_t * pNtk );
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command is applicable to logic networks.\n" );
        return 1;
    }

    Abc_NtkAutoDebug( pNtk, Abc_NtkRetimeDebug );
    return 0;

usage:
    Abc_Print( -2, "usage: debug [-h]\n" );
    Abc_Print( -2, "\t        performs automated debugging of the given procedure\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}